

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Type * __thiscall slang::ast::PortSymbol::getType(PortSymbol *this)

{
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  ValueSymbol *symbol;
  Expression *pEVar4;
  Compilation *this_00;
  undefined4 extraout_var;
  PortSymbol *in_RDI;
  Type *errorType;
  PortBackrefVisitor visitor;
  ASTContext context_1;
  ArgumentDirection checkDir;
  bitmask<slang::ast::ASTFlags> astFlags_1;
  ExplicitAnsiPortSyntax *eaps;
  AssignFlags flags;
  ElementSelectSyntax *select;
  PortReferenceSyntax *prs;
  Expression *valExpr;
  ASTContext context;
  SourceRange in_stack_000001e0;
  bitmask<slang::ast::ASTFlags> astFlags;
  DeclaredType *dt;
  SyntaxNode *syntax;
  Scope *scope;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffddc;
  Symbol *in_stack_fffffffffffffde0;
  PortSymbol *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined2 in_stack_fffffffffffffdf4;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  AssignFlags value;
  Scope *in_stack_fffffffffffffdf8;
  Type **in_stack_fffffffffffffe00;
  ValueSymbol *in_stack_fffffffffffffe08;
  ASTContext *in_stack_fffffffffffffe18;
  bitmask<slang::ast::AssignFlags> bVar6;
  Type *in_stack_fffffffffffffe28;
  Diagnostic *in_stack_fffffffffffffe30;
  ASTContext *in_stack_fffffffffffffe38;
  Expression *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  SourceLocation in_stack_fffffffffffffe58;
  Type *local_198;
  PortBackrefVisitor local_190;
  bitmask<slang::ast::AssignFlags> local_181;
  SourceLocation in_stack_fffffffffffffe80;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  bitmask<slang::ast::ASTFlags> bVar7;
  DiagCode code;
  sockaddr local_158 [3];
  bitmask<slang::ast::ASTFlags> local_120;
  bitmask<slang::ast::ASTFlags> local_118;
  ArgumentDirection local_10c;
  bitmask<slang::ast::ASTFlags> local_108;
  ExplicitAnsiPortSyntax *local_100;
  bitmask<slang::ast::AssignFlags> local_f2;
  bitmask<slang::ast::AssignFlags> local_f1;
  SourceLocation local_f0;
  AssignFlags local_e1;
  ElementSelectSyntax *local_e0;
  PortReferenceSyntax *local_d8;
  SourceLocation local_d0;
  SourceLocation startLoc;
  SourceLocation in_stack_ffffffffffffff40;
  SourceLocation in_stack_ffffffffffffff48;
  bitmask<slang::ast::ASTFlags> bVar8;
  bitmask<slang::ast::ASTFlags> local_48;
  bitmask<slang::ast::ASTFlags> local_40;
  underlying_type local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  DeclaredType *local_28;
  SyntaxNode *local_20;
  Type *local_18;
  Type *local_8;
  
  code = SUB84((ulong)in_stack_fffffffffffffe90 >> 0x20,0);
  if (in_RDI->type == (Type *)0x0) {
    local_18 = (Type *)Symbol::getParentScope(&in_RDI->super_Symbol);
    local_20 = Symbol::getSyntax(&in_RDI->super_Symbol);
    if (in_RDI->internalSymbol == (Symbol *)0x0) {
      if ((in_RDI->isNullPort & 1U) == 0) {
        local_100 = slang::syntax::SyntaxNode::as<slang::syntax::ExplicitAnsiPortSyntax>(local_20);
        bVar6.m_bits = (underlying_type)((uint)in_stack_fffffffffffffe54 >> 0x18);
        local_108 = ast::operator|((ASTFlags)in_stack_fffffffffffffde8,
                                   (ASTFlags)in_stack_fffffffffffffde0);
        local_10c = in_RDI->direction;
        in_stack_fffffffffffffe00 = (Type **)(ulong)in_RDI->direction;
        switch(in_stack_fffffffffffffe00) {
        case (Type **)0x0:
          local_10c = Out;
          bitmask<slang::ast::ASTFlags>::bitmask(&local_118,LValue);
          bitmask<slang::ast::ASTFlags>::operator|=(&local_108,&local_118);
          break;
        case (Type **)0x1:
          local_10c = In;
          break;
        case (Type **)0x2:
          bitmask<slang::ast::ASTFlags>::bitmask(&local_120,LValue);
          bitmask<slang::ast::ASTFlags>::operator|=(&local_108,&local_120);
          break;
        case (Type **)0x3:
        }
        lookupLocation_00._8_8_ = in_stack_fffffffffffffe00;
        lookupLocation_00.scope = in_stack_fffffffffffffdf8;
        bVar8.m_bits._4_2_ = in_stack_fffffffffffffdf4;
        bVar8.m_bits._0_4_ = in_stack_fffffffffffffdf0;
        bVar8.m_bits._6_1_ = in_stack_fffffffffffffdf6;
        bVar8.m_bits._7_1_ = in_stack_fffffffffffffdf7;
        bVar7.m_bits = local_108.m_bits;
        ASTContext::ASTContext
                  ((ASTContext *)in_stack_fffffffffffffde8,(Scope *)in_stack_fffffffffffffde0,
                   lookupLocation_00,bVar8);
        code = SUB84(bVar7.m_bits >> 0x20,0);
        iVar2 = (int)local_100->expr;
        bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffe88,None);
        iVar2 = Expression::bind(iVar2,local_158,(socklen_t)in_stack_fffffffffffffe88.m_bits);
        in_RDI->internalExpr = (Expression *)CONCAT44(extraout_var,iVar2);
        pTVar3 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x107878a);
        in_RDI->type = pTVar3;
        bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffde0);
        if (!bVar1) {
          in_stack_fffffffffffffe80 = (in_RDI->super_Symbol).location;
          value = InputPort;
          if (in_RDI->direction != In) {
            value = None;
          }
          bitmask<slang::ast::AssignFlags>::bitmask(&local_181,value);
          Expression::checkConnectionDirection
                    (in_stack_fffffffffffffe48,(ArgumentDirection)((ulong)in_RDI >> 0x20),
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe58,bVar6);
          anon_unknown_0::PortBackrefVisitor::PortBackrefVisitor(&local_190,in_RDI);
          Expression::visit<slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
                    ((Expression *)in_stack_fffffffffffffde0,
                     (PortBackrefVisitor *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        }
      }
      else {
        this_00 = Scope::getCompilation((Scope *)local_18);
        pTVar3 = Compilation::getVoidType(this_00);
        in_RDI->type = pTVar3;
      }
    }
    else {
      local_28 = Symbol::getDeclaredType(&in_stack_fffffffffffffde8->super_Symbol);
      pTVar3 = DeclaredType::getType
                         ((DeclaredType *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      in_RDI->type = pTVar3;
      local_38 = (underlying_type)
                 ast::operator|((ASTFlags)in_stack_fffffffffffffde8,
                                (ASTFlags)in_stack_fffffffffffffde0);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_40,NoReference);
      local_30 = bitmask<slang::ast::ASTFlags>::operator|
                           ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffde8,
                            (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffde0);
      if (in_RDI->direction != Out) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_48,LValue);
        bitmask<slang::ast::ASTFlags>::operator|=(&local_30,&local_48);
      }
      in_stack_fffffffffffffe28 = local_18;
      LookupLocation::before(in_stack_fffffffffffffde0);
      lookupLocation._8_8_ = in_stack_fffffffffffffe00;
      lookupLocation.scope = in_stack_fffffffffffffdf8;
      bVar7.m_bits._4_2_ = in_stack_fffffffffffffdf4;
      bVar7.m_bits._0_4_ = in_stack_fffffffffffffdf0;
      bVar7.m_bits._6_1_ = in_stack_fffffffffffffdf6;
      bVar7.m_bits._7_1_ = in_stack_fffffffffffffdf7;
      bVar8.m_bits = local_30.m_bits;
      ASTContext::ASTContext
                ((ASTContext *)in_stack_fffffffffffffde8,(Scope *)in_stack_fffffffffffffde0,
                 lookupLocation,bVar7);
      startLoc = (in_RDI->super_Symbol).location;
      in_stack_fffffffffffffe30 = (Diagnostic *)&(in_RDI->super_Symbol).location;
      std::basic_string_view<char,_std::char_traits<char>_>::length(&(in_RDI->super_Symbol).name);
      local_d0 = SourceLocation::operator+<unsigned_long>
                           ((SourceLocation *)in_stack_fffffffffffffde8,
                            (unsigned_long)in_stack_fffffffffffffde0);
      SourceRange::SourceRange((SourceRange *)&stack0xffffffffffffff40,startLoc,local_d0);
      uVar5 = 0;
      symbol = (ValueSymbol *)
               ValueExpressionBase::fromSymbol
                         ((ASTContext *)context.assertionInstance,(Symbol *)context.randomizeDetails
                          ,(HierarchicalReference *)context.firstTempVar,in_stack_000001e0,
                          context.instanceOrProc._7_1_,context.instanceOrProc._6_1_);
      if (local_20->kind == PortReference) {
        local_d8 = slang::syntax::SyntaxNode::as<slang::syntax::PortReferenceSyntax>(local_20);
        local_e0 = local_d8->select;
        if (local_e0 != (ElementSelectSyntax *)0x0) {
          pEVar4 = Expression::bindSelector
                             ((Expression *)in_stack_fffffffffffffde0,
                              (ElementSelectSyntax *)CONCAT44(in_stack_fffffffffffffddc,uVar5),
                              (ASTContext *)0x1078487);
          in_RDI->internalExpr = pEVar4;
          pTVar3 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x10784a0)
          ;
          in_RDI->type = pTVar3;
        }
      }
      Symbol::as<slang::ast::ValueSymbol>((Symbol *)0x10784bc);
      ValueSymbol::addPortBackref
                ((ValueSymbol *)
                 CONCAT17(in_stack_fffffffffffffdf7,
                          CONCAT16(in_stack_fffffffffffffdf6,
                                   CONCAT24(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))),
                 in_stack_fffffffffffffde8);
      if ((in_RDI->direction == In) || (in_RDI->direction == InOut)) {
        bVar6.m_bits = InputPort;
        if (in_RDI->direction != In) {
          bVar6.m_bits = InOutPort;
        }
        local_e1 = bVar6.m_bits;
        if (in_RDI->internalExpr == (Expression *)0x0) {
          in_stack_fffffffffffffe08 = Symbol::as<slang::ast::ValueSymbol>((Symbol *)0x1078582);
          bitmask<slang::ast::AssignFlags>::bitmask(&local_f2,local_e1);
          ASTContext::addDriver
                    (in_stack_fffffffffffffe18,symbol,(Expression *)in_stack_fffffffffffffe08,bVar6)
          ;
        }
        else {
          SourceLocation::SourceLocation(&local_f0);
          bVar6.m_bits = (underlying_type)((ulong)symbol >> 0x38);
          bitmask<slang::ast::AssignFlags>::bitmask(&local_f1,local_e1);
          Expression::requireLValue
                    ((Expression *)in_stack_ffffffffffffff48,(ASTContext *)in_stack_ffffffffffffff40
                     ,(SourceLocation)bVar8.m_bits,bVar6,(Expression *)startLoc);
        }
      }
    }
    bVar1 = Type::isValidForPort((Type *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    if (!bVar1) {
      if (local_198 == in_RDI->type) {
        Scope::addDiag((Scope *)in_stack_fffffffffffffe80,code,
                       (SourceLocation)in_stack_fffffffffffffe88.m_bits);
        ast::operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      }
      else {
        Scope::addDiag((Scope *)in_stack_fffffffffffffe80,code,
                       (SourceLocation)in_stack_fffffffffffffe88.m_bits);
        ast::operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        ast::operator<<(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      }
    }
    local_8 = in_RDI->type;
  }
  else {
    local_8 = in_RDI->type;
  }
  return local_8;
}

Assistant:

const Type& PortSymbol::getType() const {
    if (type)
        return *type;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    if (internalSymbol) {
        auto dt = internalSymbol->getDeclaredType();
        SLANG_ASSERT(dt);
        type = &dt->getType();

        bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::AllowInterconnect |
                                     ASTFlags::NoReference;
        if (direction != ArgumentDirection::Out)
            astFlags |= ASTFlags::LValue;

        ASTContext context(*scope, LookupLocation::before(*this), astFlags);

        auto& valExpr = ValueExpressionBase::fromSymbol(context, *internalSymbol, nullptr,
                                                        {location, location + name.length()});

        if (syntax->kind == SyntaxKind::PortReference) {
            auto& prs = syntax->as<PortReferenceSyntax>();
            if (auto select = prs.select) {
                internalExpr = &Expression::bindSelector(valExpr, *select, context);
                type = internalExpr->type;
            }
        }

        internalSymbol->as<ValueSymbol>().addPortBackref(*this);
        if (direction == ArgumentDirection::In || direction == ArgumentDirection::InOut) {
            // Ensure that this driver gets registered with the internal symbol.
            auto flags = direction == ArgumentDirection::In ? AssignFlags::InputPort
                                                            : AssignFlags::InOutPort;
            if (internalExpr) {
                internalExpr->requireLValue(context, {}, flags);
            }
            else {
                context.addDriver(internalSymbol->as<ValueSymbol>(), valExpr, flags);
            }
        }
    }
    else if (isNullPort) {
        type = &scope->getCompilation().getVoidType();
    }
    else {
        // We should have an explicit port connection expression here.
        auto& eaps = syntax->as<ExplicitAnsiPortSyntax>();
        SLANG_ASSERT(eaps.expr);

        // The direction of the connection is reversed, as data coming in to an input
        // port flows out to the internal symbol, and vice versa. Inout and ref
        // ports don't change.
        bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::NoReference;
        ArgumentDirection checkDir = direction;
        switch (direction) {
            case ArgumentDirection::In:
                checkDir = ArgumentDirection::Out;
                astFlags |= ASTFlags::LValue;
                break;
            case ArgumentDirection::Out:
                checkDir = ArgumentDirection::In;
                break;
            case ArgumentDirection::InOut:
                astFlags |= ASTFlags::LValue;
                break;
            case ArgumentDirection::Ref:
                break;
        }

        ASTContext context(*scope, LookupLocation::max, astFlags);
        internalExpr = &Expression::bind(*eaps.expr, context);
        type = internalExpr->type;

        if (!internalExpr->bad()) {
            Expression::checkConnectionDirection(*internalExpr, checkDir, context, location,
                                                 direction == ArgumentDirection::In
                                                     ? AssignFlags::InputPort
                                                     : AssignFlags::None);

            PortBackrefVisitor visitor(*this);
            internalExpr->visit(visitor);
        }
    }

    const Type* errorType;
    if (!type->isValidForPort(&errorType)) {
        if (errorType == type)
            scope->addDiag(diag::InvalidPortType, location) << *type;
        else
            scope->addDiag(diag::InvalidPortSubType, location) << *type << *errorType;
    }

    return *type;
}